

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RtMidi.cpp
# Opt level: O3

void __thiscall MidiInAlsa::initialize(MidiInAlsa *this,string *clientName)

{
  undefined8 uVar1;
  pointer pcVar2;
  int iVar3;
  undefined4 uVar4;
  undefined8 *puVar5;
  pthread_t pVar6;
  long lVar7;
  size_t __n;
  void *__s;
  _Alloc_hider _Var8;
  undefined8 uStack_70;
  string local_68;
  string local_48;
  undefined8 local_28;
  snd_seq_t *seq;
  
  uStack_70 = 0x10cbdb;
  iVar3 = snd_seq_open(&local_28,"default",3,1);
  if (iVar3 < 0) {
    uStack_70 = 0x10ccd2;
    std::__cxx11::string::_M_replace
              ((ulong)&(this->super_MidiInApi).super_MidiApi.errorString_,0,
               (char *)(this->super_MidiInApi).super_MidiApi.errorString_._M_string_length,0x110a83)
    ;
    pcVar2 = (this->super_MidiInApi).super_MidiApi.errorString_._M_dataplus._M_p;
    uStack_70 = 0x10ccf1;
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_68,pcVar2,
               pcVar2 + (this->super_MidiInApi).super_MidiApi.errorString_._M_string_length);
    uStack_70 = 0x10cd01;
    MidiApi::error((MidiApi *)this,DRIVER_ERROR,&local_68);
    _Var8._M_p = local_68._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p == &local_68.field_2) {
      return;
    }
  }
  else {
    uStack_70 = 0x10cbef;
    snd_seq_set_client_name(local_28);
    uStack_70 = 0x10cbf9;
    puVar5 = (undefined8 *)operator_new(0x58);
    *puVar5 = local_28;
    puVar5[1] = 0xffffffffffffffff;
    puVar5[2] = 0;
    uStack_70 = 0x10cc1b;
    pVar6 = pthread_self();
    puVar5[7] = pVar6;
    puVar5[6] = pVar6;
    *(undefined8 *)((long)puVar5 + 0x4c) = 0xffffffffffffffff;
    (this->super_MidiInApi).super_MidiApi.apiData_ = puVar5;
    (this->super_MidiInApi).inputData_.apiData = puVar5;
    uStack_70 = 0x10cc3b;
    iVar3 = pipe((int *)((long)puVar5 + 0x4c));
    if (iVar3 != -1) {
      uStack_70 = 0x10cc54;
      uVar4 = snd_seq_alloc_named_queue(local_28);
      *(undefined4 *)(puVar5 + 9) = uVar4;
      uStack_70 = 0x10cc5d;
      lVar7 = snd_seq_queue_tempo_sizeof();
      lVar7 = -(lVar7 + 0xfU & 0xfffffffffffffff0);
      __s = (void *)((long)&local_68 + lVar7);
      *(undefined8 *)((long)&uStack_70 + lVar7) = 0x10cc73;
      __n = snd_seq_queue_tempo_sizeof();
      *(undefined8 *)((long)&uStack_70 + lVar7) = 0x10cc80;
      memset(__s,0,__n);
      *(undefined8 *)((long)&uStack_70 + lVar7) = 0x10cc8d;
      snd_seq_queue_tempo_set_tempo(__s,600000);
      *(undefined8 *)((long)&uStack_70 + lVar7) = 0x10cc9a;
      snd_seq_queue_tempo_set_ppq(__s,0xf0);
      uVar1 = *puVar5;
      uVar4 = *(undefined4 *)(puVar5 + 9);
      *(undefined8 *)((long)&uStack_70 + lVar7) = 0x10cca9;
      snd_seq_set_queue_tempo(uVar1,uVar4,__s);
      uVar1 = *puVar5;
      *(undefined8 *)((long)&uStack_70 + lVar7) = 0x10ccb1;
      snd_seq_drain_output(uVar1);
      return;
    }
    uStack_70 = 0x10cd2c;
    std::__cxx11::string::_M_replace
              ((ulong)&(this->super_MidiInApi).super_MidiApi.errorString_,0,
               (char *)(this->super_MidiInApi).super_MidiApi.errorString_._M_string_length,0x110ac8)
    ;
    pcVar2 = (this->super_MidiInApi).super_MidiApi.errorString_._M_dataplus._M_p;
    uStack_70 = 0x10cd4b;
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_48,pcVar2,
               pcVar2 + (this->super_MidiInApi).super_MidiApi.errorString_._M_string_length);
    uStack_70 = 0x10cd5b;
    MidiApi::error((MidiApi *)this,DRIVER_ERROR,&local_48);
    local_68.field_2._M_allocated_capacity = local_48.field_2._M_allocated_capacity;
    _Var8._M_p = local_48._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p == &local_48.field_2) {
      return;
    }
  }
  uStack_70 = 0x10cd70;
  operator_delete(_Var8._M_p,local_68.field_2._M_allocated_capacity + 1);
  return;
}

Assistant:

void MidiInAlsa :: initialize( const std::string& clientName )
{
  // Set up the ALSA sequencer client.
  snd_seq_t *seq;
  int result = snd_seq_open( &seq, "default", SND_SEQ_OPEN_DUPLEX, SND_SEQ_NONBLOCK );
  if ( result < 0 ) {
    errorString_ = "MidiInAlsa::initialize: error creating ALSA sequencer client object.";
    error( RtMidiError::DRIVER_ERROR, errorString_ );
    return;
  }

  // Set client name.
  snd_seq_set_client_name( seq, clientName.c_str() );

  // Save our api-specific connection information.
  AlsaMidiData *data = (AlsaMidiData *) new AlsaMidiData;
  data->seq = seq;
  data->portNum = -1;
  data->vport = -1;
  data->subscription = 0;
  data->dummy_thread_id = pthread_self();
  data->thread = data->dummy_thread_id;
  data->trigger_fds[0] = -1;
  data->trigger_fds[1] = -1;
  apiData_ = (void *) data;
  inputData_.apiData = (void *) data;

  if ( pipe(data->trigger_fds) == -1 ) {
    errorString_ = "MidiInAlsa::initialize: error creating pipe objects.";
    error( RtMidiError::DRIVER_ERROR, errorString_ );
    return;
  }

  // Create the input queue
#ifndef AVOID_TIMESTAMPING
  data->queue_id = snd_seq_alloc_named_queue( seq, "RtMidi Queue" );
  // Set arbitrary tempo (mm=100) and resolution (240)
  snd_seq_queue_tempo_t *qtempo;
  snd_seq_queue_tempo_alloca( &qtempo );
  snd_seq_queue_tempo_set_tempo( qtempo, 600000 );
  snd_seq_queue_tempo_set_ppq( qtempo, 240 );
  snd_seq_set_queue_tempo( data->seq, data->queue_id, qtempo );
  snd_seq_drain_output( data->seq );
#endif
}